

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O2

void p_hash_table_insert(PHashTable *table,ppointer key,ppointer value)

{
  PHashTableNode **ppPVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  PHashTableNode *pPVar4;
  ulong uVar5;
  
  if (table != (PHashTable *)0x0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = table->size;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)((int)key + 0x25);
    pPVar4 = pp_hash_table_find_node(table,key,SUB164(auVar3 % auVar2,0));
    if (pPVar4 == (PHashTableNode *)0x0) {
      pPVar4 = (PHashTableNode *)p_malloc0(0x18);
      if (pPVar4 == (PHashTableNode *)0x0) {
        printf("** Error: %s **\n","PHashTable::p_hash_table_insert: failed to allocate memory");
        return;
      }
      pPVar4->key = key;
      pPVar4->value = value;
      ppPVar1 = table->table;
      uVar5 = SUB168(auVar3 % auVar2,0) & 0xffffffff;
      pPVar4->next = ppPVar1[uVar5];
      ppPVar1[uVar5] = pPVar4;
    }
    else {
      pPVar4->value = value;
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_hash_table_insert (PHashTable *table, ppointer key, ppointer value)
{
	PHashTableNode	*node;
	puint		hash;

	if (P_UNLIKELY (table == NULL))
		return;

	hash = pp_hash_table_calc_hash (key, table->size);

	if ((node = pp_hash_table_find_node (table, key, hash)) == NULL) {
		if (P_UNLIKELY ((node = p_malloc0 (sizeof (PHashTableNode))) == NULL)) {
			P_ERROR ("PHashTable::p_hash_table_insert: failed to allocate memory");
			return;
		}

		/* Insert a new node in front of others */
		node->key   = key;
		node->value = value;
		node->next  = table->table[hash];

		table->table[hash] = node;
	} else
		node->value = value;
}